

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O0

void mhurtle(monst *mon,int dx,int dy,int range)

{
  int iVar1;
  coord local_20;
  coord local_1e;
  int local_1c;
  coord cc;
  coord mc;
  int range_local;
  int dy_local;
  int dx_local;
  monst *mon_local;
  
  mon->movement = 0;
  *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xffefffff | 0x100000;
  if (((mon->data->msize < 4) && (mon != u.ustuck)) &&
     ((*(uint *)&mon->field_0x60 >> 0x17 & 1) == 0)) {
    local_1c = range;
    _cc = dy;
    iVar1 = sgn(dx);
    _cc = sgn(_cc);
    if ((local_1c != 0) && ((iVar1 != 0 || (_cc != 0)))) {
      local_1e.x = mon->mx;
      local_1e.y = mon->my;
      local_20.x = mon->mx + (char)iVar1 * (char)local_1c;
      local_20.y = mon->my + (char)_cc * (char)local_1c;
      walk_path(&local_1e,&local_20,mhurtle_step,mon);
    }
  }
  return;
}

Assistant:

void mhurtle(struct monst *mon, int dx, int dy, int range)
{
    coord mc, cc;

	/* At the very least, debilitate the monster */
	mon->movement = 0;
	mon->mstun = 1;

	/* Is the monster stuck or too heavy to push?
	 * (very large monsters have too much inertia, even floaters and flyers)
	 */
	if (mon->data->msize >= MZ_HUGE || mon == u.ustuck || mon->mtrapped)
	    return;

    /* Make sure dx and dy are [-1,0,1] */
    dx = sgn(dx);
    dy = sgn(dy);
    if (!range || (!dx && !dy)) return; /* paranoia */

	/* Send the monster along the path */
	mc.x = mon->mx;
	mc.y = mon->my;
	cc.x = mon->mx + (dx * range);
	cc.y = mon->my + (dy * range);
	walk_path(&mc, &cc, mhurtle_step, mon);
	return;
}